

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O0

populator_set *
spdlog::populators::
make_populator_set<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
          (unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
           *args,unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
                 *args_1,
          unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
          *args_2,unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
                  *args_3)

{
  populator_set *in_RDI;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>,_bool>
  pVar1;
  int dummy [4];
  populator_set *ret;
  unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
  *this;
  unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  *in_stack_fffffffffffffec8;
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  *__u;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  local_a8;
  _Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
  local_a0;
  undefined1 local_98;
  _Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
  local_88;
  undefined1 local_80;
  _Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
  local_70;
  undefined1 local_68;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
  local_3c [2];
  undefined1 local_29;
  
  local_29 = 0;
  std::
  unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
  ::unordered_set((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                   *)0x13d589);
  std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>
  ::
  unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>,void>
            ((unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  pVar1 = std::
          unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
          ::insert((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   (value_type *)in_stack_fffffffffffffec8);
  local_70._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
       ._M_cur;
  local_68 = pVar1.second;
  local_48 = 0;
  std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>
  ::
  unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>,void>
            ((unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
              *)in_stack_fffffffffffffec8);
  pVar1 = std::
          unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
          ::insert((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   (value_type *)in_stack_fffffffffffffec8);
  local_88._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
       ._M_cur;
  local_80 = pVar1.second;
  local_44 = 0;
  std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>
  ::
  unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>,void>
            ((unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
              *)in_stack_fffffffffffffec8);
  pVar1 = std::
          unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
          ::insert((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   (value_type *)in_stack_fffffffffffffec8);
  local_a0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
       ._M_cur;
  local_98 = pVar1.second;
  local_40 = 0;
  this = local_3c;
  __u = &local_a8;
  std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>
  ::
  unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>,void>
            ((unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),__u);
  std::
  unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
  ::insert((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),(value_type *)__u);
  *(undefined4 *)
   &(this->_M_t).
    super___uniq_ptr_impl<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::populators::populator_*,_std::default_delete<spdlog::populators::populator>_>
    .super__Head_base<0UL,_spdlog::populators::populator_*,_false>._M_head_impl = 0;
  std::
  unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>::
  ~unique_ptr(this);
  std::
  unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>::
  ~unique_ptr(this);
  std::
  unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>::
  ~unique_ptr(this);
  std::
  unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>::
  ~unique_ptr(this);
  return in_RDI;
}

Assistant:

populator_set make_populator_set(Args &&... args)
{
    populator_set ret;
    int dummy[] = {(ret.insert(std::move(std::forward<Args>(args))), 0)...};
    (void)dummy;
    return ret;
}